

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

QWidget * __thiscall
QItemDelegate::createEditor
          (QItemDelegate *this,QWidget *parent,QStyleOptionViewItem *param_2,QModelIndex *index)

{
  uint uVar1;
  int iVar2;
  QItemEditorFactory *pQVar3;
  undefined4 extraout_var;
  QAbstractItemModel *pQVar4;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  QWidget *this_00;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (index->m).ptr;
  if (pQVar4 != (QAbstractItemModel *)0x0 && -1 < (index->c | index->r)) {
    pQVar3 = *(QItemEditorFactory **)
              (*(long *)&(this->super_QAbstractItemDelegate).field_0x8 + 0x78);
    if (pQVar3 == (QItemEditorFactory *)0x0) {
      pQVar3 = QItemEditorFactory::defaultFactory();
      pQVar4 = (index->m).ptr;
      if (pQVar4 != (QAbstractItemModel *)0x0) goto LAB_00559348;
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      local_30 = 2;
    }
    else {
LAB_00559348:
      (**(code **)(*(long *)pQVar4 + 0x90))(&local_48,pQVar4,index,2);
    }
    uVar1 = ::QVariant::typeId((QVariant *)&local_48);
    iVar2 = (*pQVar3->_vptr_QItemEditorFactory[2])(pQVar3,(ulong)uVar1,parent);
    this_00 = (QWidget *)CONCAT44(extraout_var,iVar2);
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (this_00 != (QWidget *)0x0) {
      QWidget::setFocusPolicy(this_00,WheelFocus);
      goto LAB_00559396;
    }
  }
  this_00 = (QWidget *)0x0;
LAB_00559396:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QItemDelegate::createEditor(QWidget *parent,
                                     const QStyleOptionViewItem &,
                                     const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    if (!index.isValid())
        return nullptr;
    const QItemEditorFactory *factory = d->f;
    if (factory == nullptr)
        factory = QItemEditorFactory::defaultFactory();
    QWidget *w = factory->createEditor(index.data(Qt::EditRole).userType(), parent);
    if (w)
        w->setFocusPolicy(Qt::WheelFocus);
    return w;
}